

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.hpp
# Opt level: O2

void __thiscall
SCSI::Target::Executor::Inquiry::Inquiry(Inquiry *this,char *vendor,char *product,char *revision)

{
  size_t sVar1;
  
  this->ansi_standard = '\0';
  this->supports_asynchronous_events = false;
  this->supports_terminate_io_process = false;
  this->supports_relative_addressing = false;
  this->device_type = DirectAccess;
  this->is_removeable = false;
  this->iso_standard = '\0';
  this->ecma_standard = '\0';
  this->ansi_standard = '\0';
  this->supports_synchronous_transfer = true;
  this->supports_linked_commands = false;
  this->supports_command_queing = false;
  this->supports_soft_reset = false;
  this->vendor_identifier[0] = '\0';
  this->vendor_identifier[1] = '\0';
  this->vendor_identifier[2] = '\0';
  this->vendor_identifier[3] = '\0';
  this->vendor_identifier[4] = '\0';
  *(undefined8 *)(this->vendor_identifier + 5) = 0;
  this->product_identifier[4] = '\0';
  this->product_identifier[5] = '\0';
  this->product_identifier[6] = '\0';
  this->product_identifier[7] = '\0';
  this->product_identifier[8] = '\0';
  this->product_identifier[9] = '\0';
  this->product_identifier[10] = '\0';
  this->product_identifier[0xb] = '\0';
  *(undefined8 *)(this->product_identifier + 0xc) = 0;
  this->product_revision_level[3] = '\0';
  this->product_revision_level[4] = '\0';
  sVar1 = strlen(vendor);
  if (8 < sVar1) {
    __assert_fail("strlen(vendor) <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/MassStorage/SCSI/Target.hpp"
                  ,0xef,
                  "SCSI::Target::Executor::Inquiry::Inquiry(const char *, const char *, const char *)"
                 );
  }
  sVar1 = strlen(product);
  if (sVar1 < 0x11) {
    sVar1 = strlen(revision);
    if (sVar1 < 5) {
      strcpy(this->vendor_identifier,vendor);
      strcpy(this->product_identifier,product);
      strcpy(this->product_revision_level,revision);
      return;
    }
    __assert_fail("strlen(revision) <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/MassStorage/SCSI/Target.hpp"
                  ,0xf1,
                  "SCSI::Target::Executor::Inquiry::Inquiry(const char *, const char *, const char *)"
                 );
  }
  __assert_fail("strlen(product) <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/MassStorage/SCSI/Target.hpp"
                ,0xf0,
                "SCSI::Target::Executor::Inquiry::Inquiry(const char *, const char *, const char *)"
               );
}

Assistant:

Inquiry(const char *vendor, const char *product, const char *revision) {
			assert(strlen(vendor) <= 8);
			assert(strlen(product) <= 16);
			assert(strlen(revision) <= 4);
			strcpy(vendor_identifier, vendor);
			strcpy(product_identifier, product);
			strcpy(product_revision_level, revision);
		}